

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

int abuf_puts(autobuf *autobuf,char *s)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  char *s_local;
  autobuf *autobuf_local;
  
  if ((autobuf == (autobuf *)0x0) || (s == (char *)0x0)) {
    autobuf_local._4_4_ = 0;
  }
  else {
    sVar2 = strlen(s);
    iVar1 = _autobuf_enlarge(autobuf,autobuf->_len + sVar2 + 1);
    if (iVar1 < 0) {
      autobuf_local._4_4_ = -1;
    }
    else {
      strcpy(autobuf->_buf + autobuf->_len,s);
      autobuf->_len = sVar2 + autobuf->_len;
      autobuf_local._4_4_ = (int)sVar2;
    }
  }
  return autobuf_local._4_4_;
}

Assistant:

int
abuf_puts(struct autobuf *autobuf, const char *s) {
  size_t len;

  if (autobuf == NULL || s == NULL)
    return 0;

  len = strlen(s);
  if (_autobuf_enlarge(autobuf, autobuf->_len + len + 1) < 0) {
    return -1;
  }
  strcpy(autobuf->_buf + autobuf->_len, s);
  autobuf->_len += len;
  return len;
}